

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O3

string * __thiscall
cpp_client::Base_game::get_alias_abi_cxx11_
          (string *__return_storage_ptr__,Base_game *this,char *name,char *server,int port)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  Type this_00;
  long *plVar4;
  char *name_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  Connection conn;
  string resp;
  string alias;
  Document doc;
  char local_101;
  string local_100;
  Connection local_e0;
  string local_d0;
  long *local_b0;
  void *local_a8;
  long local_a0;
  long lStack_98;
  Data local_90;
  long local_80;
  long lStack_78;
  
  Connection::Connection(&local_e0,false);
  Connection::connect(&local_e0,(int)name,(sockaddr *)((ulong)server & 0xffffffff),0);
  std::__cxx11::string::string((string *)&local_d0,(char *)this,(allocator *)&local_100);
  iVar1 = 0x1c;
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x12c0b8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90.s.str = (Ch *)&local_80;
  }
  else {
    local_80 = *plVar4;
    local_90.n = (Number)(long *)*plVar2;
  }
  local_90._8_8_ = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  __buf = (void *)plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_a8 = __buf;
  if ((long *)local_90.s.str != &local_80) {
    operator_delete((void *)local_90.n);
    __buf = extraout_RDX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
    __buf = extraout_RDX_00;
  }
  Connection::send(&local_e0,(int)&local_b0,__buf,(size_t)plVar4,iVar1);
  Connection::recieve_abi_cxx11_(&local_d0,&local_e0);
  name_00 = (char *)0x0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_90.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_100._M_dataplus._M_p = local_d0._M_dataplus._M_p;
  local_100._M_string_length = (size_type)local_d0._M_dataplus._M_p;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_90.s,(GenericStringStream<rapidjson::UTF8<char>_> *)&local_100);
  attr_wrapper::get_attribute<std::__cxx11::string>
            (&local_100,(attr_wrapper *)&local_90.s,(Value *)"event",name_00);
  iVar1 = std::__cxx11::string::compare((char *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (iVar1 != 0) {
    attr_wrapper::get_attribute<std::__cxx11::string>
              (__return_storage_ptr__,(attr_wrapper *)&local_90.s,(Value *)"data",name_00);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)&local_90.s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    Connection::~Connection(&local_e0);
    return __return_storage_ptr__;
  }
  poVar3 = ::operator<<((ostream *)&std::cout,text_red);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Fatal: ",7);
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)&local_90.s,"data");
  attr_wrapper::get_attribute<std::__cxx11::string>
            (&local_100,(attr_wrapper *)this_00,(Value *)"message",name_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_100._M_dataplus._M_p,local_100._M_string_length);
  local_101 = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_101,1);
  ::operator<<(poVar3,normal);
  std::__cxx11::string::~string((string *)&local_100);
  exit(1);
}

Assistant:

std::string Base_game::get_alias(const char* name, const char* server, int port)
{
   Connection conn;
   conn.connect(server, port, false);
   std::string alias = R"({"event": "alias", "data": ")" + std::string(name) + "\"}";
   conn.send(alias);
   const auto resp = conn.recieve();
   rapidjson::Document doc;
   doc.Parse(resp.c_str());
   if(attr_wrapper::get_attribute<std::string>(doc, "event") == "fatal")
   {
      std::cout << sgr::text_red << "Fatal: "
                << attr_wrapper::get_attribute<std::string>(doc["data"], "message") << '\n'
                << sgr::reset;
      exit(1);
   }
   return attr_wrapper::get_attribute<std::string>(doc, "data");
}